

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O2

REF_STATUS
ref_meshlink_face_curvature
          (REF_GRID ref_grid,REF_INT geom,REF_DBL *kr,REF_DBL *r,REF_DBL *ks,REF_DBL *s)

{
  *kr = 0.0;
  *r = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  *(undefined4 *)s = 0;
  *(undefined4 *)((long)s + 4) = 0;
  *(undefined4 *)(s + 1) = 0;
  *(undefined4 *)((long)s + 0xc) = 0x3ff00000;
  s[2] = 0.0;
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_face_curvature(REF_GRID ref_grid, REF_INT geom,
                                               REF_DBL *kr, REF_DBL *r,
                                               REF_DBL *ks, REF_DBL *s) {
#ifdef HAVE_MESHLINK
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  MeshAssociativityObj mesh_assoc;
  GeometryKernelObj geom_kernel = NULL;
  ProjectionDataObj projection_data = NULL;
  GeometryGroupObj geom_group = NULL;
  MLINT gref, n_entity;
  MLVector3D projected_point;
  MLVector2D uv;
  char entity_name[REF_MESHLINK_MAX_STRING_SIZE];
  MLVector3D eval_point;
  MLVector3D dXYZdU;    /* First partial derivative */
  MLVector3D dXYZdV;    /* First partial derivative */
  MLVector3D d2XYZdU2;  /* Second partial derivative */
  MLVector3D d2XYZdUdV; /* Second partial derivative */
  MLVector3D d2XYZdV2;  /* Second partial derivative */
  MLVector3D normal;
  MLVector3D principalV;
  MLREAL minCurvature;
  MLREAL maxCurvature;
  MLREAL avg;
  MLREAL gauss;
  MLORIENT orientation;
  REF_BOOL project = REF_TRUE;
  MLREAL distance;
  MLREAL tolerance;

  REIS(REF_GEOM_FACE, ref_geom_type(ref_geom, geom), "face geom expected");
  RNS(ref_geom->meshlink, "meshlink NULL");
  mesh_assoc = (MeshAssociativityObj)(ref_geom->meshlink);
  projection_data = (ProjectionDataObj)(ref_geom->meshlink_projection);

  REIS(0, ML_getActiveGeometryKernel(mesh_assoc, &geom_kernel), "kern");
  if (project) {
    MLVector3D point;
    point[0] = ref_node_xyz(ref_node, 0, ref_geom_node(ref_geom, geom));
    point[1] = ref_node_xyz(ref_node, 1, ref_geom_node(ref_geom, geom));
    point[2] = ref_node_xyz(ref_node, 2, ref_geom_node(ref_geom, geom));
    gref = (MLINT)ref_geom_id(ref_geom, geom);
    REIS(0, ML_getGeometryGroupByID(mesh_assoc, gref, &geom_group), "grp");

    if (0 != ML_projectPoint(geom_kernel, geom_group, point, projection_data)) {
      REF_INT node = ref_geom_node(ref_geom, geom);
      REF_WHERE("ML_projectPoint face failed, assumes flat")
      printf("curve failid %d xyz %f %f %f\n", ref_geom_id(ref_geom, geom),
             ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
             ref_node_xyz(ref_node, 2, node));
      *kr = 0.0;
      r[0] = 1.0;
      r[1] = 0.0;
      r[2] = 0.0;
      *ks = 0.0;
      s[0] = 0.0;
      s[1] = 1.0;
      s[2] = 0.0;
      return REF_SUCCESS;
    }
    REIS(0,
         ML_getProjectionInfo(geom_kernel, projection_data, projected_point, uv,
                              entity_name, REF_MESHLINK_MAX_STRING_SIZE,
                              &distance, &tolerance),
         "info");
  } else {
    gref = (MLINT)ref_geom_gref(ref_geom, geom);
    REIS(0, ML_getGeometryGroupByID(mesh_assoc, gref, &geom_group), "grp");
    REIB(0,
         ML_getEntityNames(geom_group, entity_name, 1,
                           REF_MESHLINK_MAX_STRING_SIZE, &n_entity),
         "grp", { printf("gref %" MLINT_FORMAT "\n", gref); });
    REIS(1, n_entity, "single entity expected");
    uv[0] = ref_geom_param(ref_geom, 0, geom);
    uv[1] = ref_geom_param(ref_geom, 1, geom);
  }
  REIS(0,
       ML_evalCurvatureOnSurface(geom_kernel, uv, entity_name, eval_point,
                                 dXYZdU, dXYZdV, d2XYZdU2, d2XYZdUdV, d2XYZdV2,
                                 normal, principalV, &minCurvature,
                                 &maxCurvature, &avg, &gauss, &orientation),
       "eval");
  r[0] = principalV[0];
  r[1] = principalV[1];
  r[2] = principalV[2];
  ref_math_cross_product(normal, r, s);
  *kr = minCurvature;
  *ks = maxCurvature;

  return REF_SUCCESS;
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_grid);
  SUPRESS_UNUSED_COMPILER_WARNING(geom);
  *kr = 0.0;
  r[0] = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  s[0] = 0.0;
  s[1] = 1.0;
  s[2] = 0.0;
  return REF_IMPLEMENT;
#endif
}